

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::Runtime::SetProperty(Runtime *this,RuntimeID id,function<bool_(Jinx::Variant_&)> *fn)

{
  bool bVar1;
  mapped_type *__args;
  mapped_type *prop;
  lock_guard<std::mutex> lock;
  function<bool_(Jinx::Variant_&)> *fn_local;
  RuntimeID id_local;
  Runtime *this_local;
  
  lock._M_device = (mutex_type *)fn;
  fn_local = (function<bool_(Jinx::Variant_&)> *)id;
  id_local = (RuntimeID)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&prop,&this->m_propertyMutex);
  __args = std::
           map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
           ::operator[](&this->m_propertyMap,(key_type *)&fn_local);
  bVar1 = std::function<bool_(Jinx::Variant_&)>::operator()(fn,__args);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&prop);
  return bVar1;
}

Assistant:

inline_t bool Runtime::SetProperty(RuntimeID id, std::function<bool(Variant &)> fn)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto& prop = m_propertyMap[id];
		return fn(prop);
	}